

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonAST.cpp
# Opt level: O0

RefAST antlr::CommonAST::factory(void)

{
  ASTRefCount<antlr::AST> *this;
  CommonAST *in_RDI;
  CommonAST *p;
  
  p = in_RDI;
  this = (ASTRefCount<antlr::AST> *)operator_new(0x48);
  CommonAST(in_RDI);
  ASTRefCount<antlr::AST>::ASTRefCount(this,(AST *)p);
  return (RefAST)(ASTRef *)p;
}

Assistant:

RefAST CommonAST::factory()
{
	return RefAST(new CommonAST);
}